

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,CombinationalStmtBlock *stmt)

{
  char *__s;
  undefined1 local_48 [8];
  string keyword;
  
  __s = "always_comb";
  if ((stmt->super_StmtBlock).field_0xdc != '\0') {
    __s = "always";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,__s,(allocator<char> *)(keyword.field_2._M_local_buf + 0xf));
  block_code(this,(string *)local_48,&stmt->super_StmtBlock);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(CombinationalStmtBlock* stmt) {
    std::string keyword = stmt->is_general_purpose() ? "always" : "always_comb";
    block_code(keyword, stmt);
}